

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeIncrVacuum(Btree *p)

{
  BtShared *pBt_00;
  Pgno nOrig_00;
  u32 nFree_00;
  Pgno nFin_00;
  Pgno nFin;
  Pgno nFree;
  Pgno nOrig;
  BtShared *pBt;
  int rc;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  sqlite3BtreeEnter(p);
  if (pBt_00->autoVacuum == '\0') {
    pBt._4_4_ = 0x65;
  }
  else {
    nOrig_00 = btreePagecount(pBt_00);
    nFree_00 = sqlite3Get4byte(pBt_00->pPage1->aData + 0x24);
    nFin_00 = finalDbSize(pBt_00,nOrig_00,nFree_00);
    if ((nOrig_00 < nFin_00) || (nOrig_00 <= nFree_00)) {
      pBt._4_4_ = sqlite3CorruptError(0x11f91);
    }
    else if (nFree_00 == 0) {
      pBt._4_4_ = 0x65;
    }
    else {
      pBt._4_4_ = saveAllCursors(pBt_00,0,(BtCursor *)0x0);
      if (pBt._4_4_ == 0) {
        invalidateAllOverflowCache(pBt_00);
        pBt._4_4_ = incrVacuumStep(pBt_00,nFin_00,nOrig_00,0);
      }
      if (pBt._4_4_ == 0) {
        pBt._4_4_ = sqlite3PagerWrite(pBt_00->pPage1->pDbPage);
        sqlite3Put4byte(pBt_00->pPage1->aData + 0x1c,pBt_00->nPage);
      }
    }
  }
  sqlite3BtreeLeave(p);
  return pBt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIncrVacuum(Btree *p){
  int rc;
  BtShared *pBt = p->pBt;

  sqlite3BtreeEnter(p);
  assert( pBt->inTransaction==TRANS_WRITE && p->inTrans==TRANS_WRITE );
  if( !pBt->autoVacuum ){
    rc = SQLITE_DONE;
  }else{
    Pgno nOrig = btreePagecount(pBt);
    Pgno nFree = get4byte(&pBt->pPage1->aData[36]);
    Pgno nFin = finalDbSize(pBt, nOrig, nFree);

    if( nOrig<nFin || nFree>=nOrig ){
      rc = SQLITE_CORRUPT_BKPT;
    }else if( nFree>0 ){
      rc = saveAllCursors(pBt, 0, 0);
      if( rc==SQLITE_OK ){
        invalidateAllOverflowCache(pBt);
        rc = incrVacuumStep(pBt, nFin, nOrig, 0);
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
        put4byte(&pBt->pPage1->aData[28], pBt->nPage);
      }
    }else{
      rc = SQLITE_DONE;
    }
  }
  sqlite3BtreeLeave(p);
  return rc;
}